

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ushort uVar1;
  ushort uVar2;
  uint num_rects;
  ImFontAtlasCustomRect *pIVar3;
  long lVar4;
  char *__function;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                  ,0x96c,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                  ,0x96f,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  psStack_30 = (stbrp_rect *)0x0;
  if (0 < (int)num_rects) {
    uVar6 = 8;
    if (7 < (int)num_rects) {
      uVar6 = num_rects;
    }
    if (0 < (int)uVar6) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((ulong)uVar6 << 4);
    }
  }
  memset(psStack_30,0,(ulong)(num_rects << 4));
  lVar4 = (long)(atlas->CustomRects).Size;
  if (0 < lVar4) {
    pIVar3 = (atlas->CustomRects).Data;
    lVar5 = 4;
    lVar7 = 0;
    do {
      if ((int)num_rects <= lVar7) goto LAB_0014ac99;
      *(undefined2 *)((long)&psStack_30->id + lVar5) =
           *(undefined2 *)((long)pIVar3 + lVar5 * 2 + -8);
      if ((atlas->CustomRects).Size <= lVar7) goto LAB_0014acb0;
      if ((int)num_rects <= lVar7) goto LAB_0014ac99;
      *(undefined2 *)((long)&psStack_30->id + lVar5 + 2) =
           *(undefined2 *)((long)pIVar3 + lVar5 * 2 + -6);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 != lVar7);
  }
  if (0 < (int)num_rects) {
    stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
    if (0 < (long)(int)num_rects) {
      lVar4 = 0xc;
      lVar5 = 0;
      do {
        if (*(int *)((long)&psStack_30->id + lVar4) != 0) {
          if ((atlas->CustomRects).Size <= lVar5) goto LAB_0014acb0;
          pIVar3 = (atlas->CustomRects).Data;
          *(undefined2 *)((long)pIVar3 + lVar4 * 2 + -0x14) =
               *(undefined2 *)((long)psStack_30 + lVar4 + -4);
          if ((int)num_rects <= lVar5) goto LAB_0014ac99;
          if ((atlas->CustomRects).Size <= lVar5) goto LAB_0014acb0;
          uVar1 = *(ushort *)((long)psStack_30 + lVar4 + -2);
          *(ushort *)((long)pIVar3 + lVar4 * 2 + -0x12) = uVar1;
          if ((int)num_rects <= lVar5) goto LAB_0014ac99;
          if ((atlas->CustomRects).Size <= lVar5) goto LAB_0014acb0;
          if ((*(short *)((long)psStack_30 + lVar4 + -8) !=
               *(short *)((long)pIVar3 + lVar4 * 2 + -0x18)) ||
             (uVar2 = *(ushort *)((long)psStack_30 + lVar4 + -6),
             uVar2 != *(ushort *)((long)pIVar3 + lVar4 * 2 + -0x16))) {
            __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                          ,0x97f,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
          }
          iVar8 = (uint)uVar2 + (uint)uVar1;
          if (iVar8 < atlas->TexHeight) {
            iVar8 = atlas->TexHeight;
          }
          atlas->TexHeight = iVar8;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((int)num_rects != lVar5);
    }
    if (psStack_30 != (stbrp_rect *)0x0) {
      ImGui::MemFree(psStack_30);
    }
    return;
  }
LAB_0014ac99:
  __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
LAB_0014acc5:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                ,0x658,__function);
LAB_0014acb0:
  __function = "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
  goto LAB_0014acc5;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}